

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFDebugLine::getOrParseLineTable
          (DWARFDebugLine *this,DWARFDataExtractor *DebugLineData,uint64_t Offset,DWARFContext *Ctx,
          DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  _Rb_tree_header *p_Var1;
  char *Fmt;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  _Base_ptr *DebugLineData_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_bool>
  pVar3;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar4;
  error_code EC;
  function<void_(llvm::Error)> *in_stack_00000008;
  LineTable local_1c8;
  pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable> local_120;
  undefined1 local_70 [40];
  Error local_48;
  Error local_40;
  undefined1 local_38 [8];
  uint64_t Offset_local;
  
  local_38 = (undefined1  [8])Ctx;
  if (Ctx < *(DWARFContext **)(Offset + 8)) {
    local_70._32_8_ = RecoverableErrorCallback;
    LineTable::LineTable(&local_1c8);
    local_120.first = (unsigned_long)local_38;
    local_120.second.UnknownRowIndex = local_1c8.UnknownRowIndex;
    local_120.second.Prologue.TotalLength = local_1c8.Prologue.TotalLength;
    local_120.second.Prologue.FormParams = local_1c8.Prologue.FormParams;
    local_120.second.Prologue._12_4_ = local_1c8.Prologue._12_4_;
    local_120.second.Prologue.PrologueLength = local_1c8.Prologue.PrologueLength;
    local_120.second.Prologue.ContentTypes = local_1c8.Prologue.ContentTypes;
    local_120.second.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.Prologue.StandardOpcodeLengths.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_120.second.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.Prologue.StandardOpcodeLengths.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_120.second.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.Prologue.StandardOpcodeLengths.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120.second.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.Prologue.IncludeDirectories.
         super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_120.second.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.Prologue.IncludeDirectories.
         super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_120.second.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.Prologue.IncludeDirectories.
         super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120.second.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1c8.Prologue.FileNames.
         super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_120.second.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.Prologue.FileNames.
         super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_120.second.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.Prologue.FileNames.
         super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120.second.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1c8.Rows.
         super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_120.second.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1c8.Rows.
         super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_120.second.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.Rows.
         super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120.second.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1c8.Sequences.
         super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_120.second.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.Sequences.
         super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_120.second.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.Sequences.
         super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar3 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
            ::_M_insert_unique<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
                        *)DebugLineData,&local_120);
    uVar2 = pVar3._8_8_;
    if (local_120.second.Sequences.
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.Sequences.
                      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.second.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX;
    }
    if (local_120.second.Rows.
        super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.Rows.
                      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.second.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_00;
    }
    if (local_120.second.Prologue.FileNames.
        super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.Prologue.FileNames.
                      super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.second.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_01;
    }
    if (local_120.second.Prologue.IncludeDirectories.
        super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.Prologue.IncludeDirectories.
                      super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.second.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_02;
    }
    if (local_120.second.Prologue.StandardOpcodeLengths.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.Prologue.StandardOpcodeLengths.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120.second.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_03;
    }
    if (local_1c8.Sequences.
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Sequences.
                      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_04;
    }
    if (local_1c8.Rows.
        super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Rows.
                      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_05;
    }
    if (local_1c8.Prologue.FileNames.
        super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.FileNames.
                      super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_06;
    }
    if (local_1c8.Prologue.IncludeDirectories.
        super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.IncludeDirectories.
                      super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_07;
    }
    if (local_1c8.Prologue.StandardOpcodeLengths.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.StandardOpcodeLengths.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar2 = extraout_RDX_08;
    }
    DebugLineData_00 = &pVar3.first._M_node._M_node[1]._M_parent;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::function<void_(llvm::Error)>::function
                ((function<void_(llvm::Error)> *)local_70,in_stack_00000008);
      LineTable::parse((LineTable *)&local_120,(DWARFDataExtractor *)DebugLineData_00,
                       (uint64_t *)Offset,(DWARFContext *)local_38,U,
                       (function<void_(llvm::Error)> *)local_70._32_8_,(raw_ostream *)local_70);
      uVar2 = extraout_RDX_09;
      if ((code *)local_70._16_8_ != (code *)0x0) {
        (*(code *)local_70._16_8_)(local_70,local_70,3);
        uVar2 = extraout_RDX_10;
      }
      if ((DWARFContext *)&DAT_00000001 < local_120.first) {
        local_40.Payload = (ErrorInfoBase *)(local_120.first | 1);
        local_120.first = 0;
        Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
                  ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_40);
        uVar2 = extraout_RDX_13;
        local_48.Payload = (ErrorInfoBase *)local_120.first;
        if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
          uVar2 = extraout_RDX_14;
          local_48.Payload = (ErrorInfoBase *)local_120.first;
        }
        goto LAB_00af09b3;
      }
    }
    p_Var1 = &(this->LineTableMap)._M_t._M_impl.super__Rb_tree_header;
    *(undefined1 *)&(p_Var1->_M_header)._M_color = (char)(p_Var1->_M_header)._M_color & 0xfe;
    *(_Base_ptr **)&(this->LineTableMap)._M_t._M_impl = DebugLineData_00;
  }
  else {
    Fmt = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_48;
    createStringError<unsigned_long>
              (EC,Fmt,(unsigned_long *)"offset 0x%8.8lx is not a valid debug line section offset");
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
              ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_48);
    uVar2 = extraout_RDX_11;
LAB_00af09b3:
    if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
      uVar2 = extraout_RDX_12;
    }
  }
  EVar4._8_8_ = uVar2;
  EVar4.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar4;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFDebugLine::getOrParseLineTable(
    DWARFDataExtractor &DebugLineData, uint64_t Offset, const DWARFContext &Ctx,
    const DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!DebugLineData.isValidOffset(Offset))
    return createStringError(errc::invalid_argument, "offset 0x%8.8" PRIx64
                       " is not a valid debug line section offset",
                       Offset);

  std::pair<LineTableIter, bool> Pos =
      LineTableMap.insert(LineTableMapTy::value_type(Offset, LineTable()));
  LineTable *LT = &Pos.first->second;
  if (Pos.second) {
    if (Error Err =
            LT->parse(DebugLineData, &Offset, Ctx, U, RecoverableErrorCallback))
      return std::move(Err);
    return LT;
  }
  return LT;
}